

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O2

void Ssw_FrmStop(Ssw_Frm_t *p)

{
  Vec_Ptr_t *__ptr;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pFrames);
  }
  __ptr = p->vAig2Frm;
  free(__ptr->pArray);
  free(__ptr);
  free(p);
  return;
}

Assistant:

void Ssw_FrmStop( Ssw_Frm_t * p )
{
    if ( p->pFrames )
        Aig_ManStop( p->pFrames );
    Vec_PtrFree( p->vAig2Frm );
    ABC_FREE( p );
}